

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

IterateResult __thiscall gl4cts::ShaderSubroutine::APITest1::iterate(APITest1 *this)

{
  undefined4 uVar1;
  int iVar2;
  APITest1 *pAVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  size_t sVar8;
  NotSupportedError *this_00;
  long lVar9;
  char *pcVar10;
  float fVar11;
  double dVar12;
  float fVar13;
  double dVar14;
  GLboolean bool_value;
  GLint int_value;
  GLfloat float_value;
  GLdouble double_value;
  GLint64 int64_value;
  char local_1f5;
  int local_1f4;
  char local_1ed;
  float local_1ec;
  char *local_1e8;
  double local_1e0;
  int local_1d4;
  long local_1d0;
  APITest1 *local_1c8;
  long local_1c0;
  long local_1b8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1c0 = CONCAT44(extraout_var,iVar6);
  bVar5 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (bVar5) {
    lVar9 = 0;
    local_1c8 = this;
    do {
      lVar4 = local_1c0;
      local_1f5 = '\0';
      local_1e0 = 0.0;
      local_1ec = 0.0;
      local_1f4 = 0;
      local_1d0 = 0;
      local_1d4 = *(int *)((long)&DAT_02129680 + lVar9);
      local_1e8 = *(char **)((long)&PTR_anon_var_dwarf_4829ed_02129678 + lVar9);
      uVar1 = *(undefined4 *)((long)&DAT_02129670 + lVar9);
      local_1b8 = lVar9;
      (**(code **)(local_1c0 + 0x798))(uVar1,&local_1f5);
      dVar7 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar7,"glGetBooleanv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x6b9);
      (**(code **)(lVar4 + 0x7f8))(uVar1,&local_1e0);
      dVar7 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar7,"glGetDoublev() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x6bc);
      (**(code **)(lVar4 + 0x818))(uVar1,&local_1ec);
      dVar7 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar7,"glGetFloatv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x6bf);
      (**(code **)(lVar4 + 0x868))(uVar1,&local_1f4);
      dVar7 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar7,"glGetIntegerv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x6c2);
      pAVar3 = local_1c8;
      (**(code **)(lVar4 + 0x850))(uVar1,&local_1d0);
      dVar7 = (**(code **)(lVar4 + 0x800))();
      iVar2 = local_1d4;
      glu::checkError(dVar7,"glGetInteger64v() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x6c5);
      iVar6 = (int)(ostringstream *)&local_1a8;
      if (local_1f4 < iVar2) {
        local_1b0 = (undefined1  [8])
                    ((pAVar3->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"GL implementation reports a value of [",0x26);
        std::ostream::operator<<((ostringstream *)&local_1a8,local_1f4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] for property [",0x10);
        pcVar10 = local_1e8;
        if (local_1e8 == (char *)0x0) {
          std::ios::clear(iVar6 + (int)local_1a8[-3]);
        }
        else {
          sVar8 = strlen(local_1e8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar10,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"], whereas the min max for the property is [",0x2c);
        std::ostream::operator<<((ostringstream *)&local_1a8,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"].",2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        pAVar3->m_has_test_passed = false;
      }
      if ((local_1f4 == 0 && local_1f5 == '\x01') || (local_1f5 != '\x01' && local_1f4 != 0)) {
        local_1b0 = (undefined1  [8])
                    ((pAVar3->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Invalid boolean value [",0x17);
        local_1ed = local_1f5;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,&local_1ed,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] reported for property [",0x19);
        pcVar10 = local_1e8;
        if (local_1e8 == (char *)0x0) {
          std::ios::clear(iVar6 + (int)local_1a8[-3]);
        }
        else {
          sVar8 = strlen(local_1e8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar10,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] (int value:[",0xe);
        std::ostream::operator<<((ostringstream *)&local_1a8,local_1f4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"])",2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        pAVar3->m_has_test_passed = false;
      }
      dVar12 = local_1e0 - (double)local_1f4;
      dVar14 = -dVar12;
      if (-dVar12 <= dVar12) {
        dVar14 = dVar12;
      }
      if (9.999999747378752e-06 < dVar14) {
        local_1b0 = (undefined1  [8])
                    ((pAVar3->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Invalid double value [",0x16);
        std::ostream::_M_insert<double>(local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] reported for property [",0x19);
        pcVar10 = local_1e8;
        if (local_1e8 == (char *)0x0) {
          std::ios::clear(iVar6 + (int)local_1a8[-3]);
        }
        else {
          sVar8 = strlen(local_1e8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar10,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] (int value:[",0xe);
        std::ostream::operator<<((ostringstream *)&local_1a8,local_1f4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"])",2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        pAVar3->m_has_test_passed = false;
      }
      fVar13 = local_1ec - (float)local_1f4;
      fVar11 = -fVar13;
      if (-fVar13 <= fVar13) {
        fVar11 = fVar13;
      }
      if (1e-05 < fVar11) {
        local_1b0 = (undefined1  [8])
                    ((pAVar3->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Invalid float value [",0x15);
        std::ostream::_M_insert<double>((double)local_1ec);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] reported for property [",0x19);
        pcVar10 = local_1e8;
        if (local_1e8 == (char *)0x0) {
          std::ios::clear(iVar6 + (int)local_1a8[-3]);
        }
        else {
          sVar8 = strlen(local_1e8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar10,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] (int value:[",0xe);
        std::ostream::operator<<((ostringstream *)&local_1a8,local_1f4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"])",2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        pAVar3->m_has_test_passed = false;
      }
      if (local_1d0 != local_1f4) {
        local_1b0 = (undefined1  [8])
                    ((pAVar3->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Invalid 64-bit integer value [",0x1e);
        std::ostream::_M_insert<double>((double)local_1ec);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] reported for property [",0x19);
        pcVar10 = local_1e8;
        if (local_1e8 == (char *)0x0) {
          std::ios::clear(iVar6 + (int)local_1a8[-3]);
        }
        else {
          sVar8 = strlen(local_1e8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar10,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"] (int value:[",0xe);
        std::ostream::operator<<((ostringstream *)&local_1a8,local_1f4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"])",2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        pAVar3->m_has_test_passed = false;
      }
      lVar9 = local_1b8 + 0x18;
    } while (lVar9 == 0x18);
    bVar5 = pAVar3->m_has_test_passed == false;
    if (bVar5) {
      pcVar10 = "Fail";
    }
    else {
      pcVar10 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((pAVar3->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar5,pcVar10)
    ;
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_1b0 = (undefined1  [8])local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,"GL_ARB_shader_subroutine is not supported.","");
  tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_1b0);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult APITest1::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Iterate over all pnames */
	const struct
	{
		glw::GLenum pname;
		const char* pname_string;
		glw::GLint  min_value;
	} pnames[] = { { GL_MAX_SUBROUTINES, "GL_MAX_SUBROUTINES", 256 },
				   { GL_MAX_SUBROUTINE_UNIFORM_LOCATIONS, "GL_MAX_SUBROUTINE_UNIFORM_LOCATIONS", 1024 } };
	const unsigned int n_pnames = sizeof(pnames) / sizeof(pnames[0]);

	for (unsigned int n_pname = 0; n_pname < n_pnames; ++n_pname)
	{
		glw::GLboolean	 bool_value   = GL_FALSE;
		glw::GLdouble	  double_value = 0.0;
		glw::GLfloat	   float_value  = 0.0f;
		glw::GLint		   int_value	= 0;
		glw::GLint64	   int64_value  = 0;
		const glw::GLint   min_value	= pnames[n_pname].min_value;
		const glw::GLenum& pname		= pnames[n_pname].pname;
		const char*		   pname_string = pnames[n_pname].pname_string;

		/* Retrieve the pname values */
		gl.getBooleanv(pname, &bool_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv() call failed.");

		gl.getDoublev(pname, &double_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetDoublev() call failed.");

		gl.getFloatv(pname, &float_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv() call failed.");

		gl.getIntegerv(pname, &int_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed.");

		gl.getInteger64v(pname, &int64_value);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInteger64v() call failed.");

		/* Make sure the value reported meets the min max requirement */
		if (int_value < min_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "GL implementation reports a value of [" << int_value
							   << "]"
								  " for property ["
							   << pname_string << "]"
												  ", whereas the min max for the property is ["
							   << min_value << "]." << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		/* Verify the other getters reported valid values */
		const float epsilon = 1e-5f;

		if (((int_value == 0) && (bool_value == GL_TRUE)) || ((int_value != 0) && (bool_value != GL_TRUE)))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid boolean value [" << bool_value
							   << "]"
								  " reported for property ["
							   << pname_string << "]"
												  " (int value:["
							   << int_value << "])" << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		if (de::abs(double_value - (double)int_value) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid double value [" << double_value
							   << "]"
								  " reported for property ["
							   << pname_string << "]"
												  " (int value:["
							   << int_value << "])" << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		if (de::abs(float_value - (float)int_value) > epsilon)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid float value [" << float_value
							   << "]"
								  " reported for property ["
							   << pname_string << "]"
												  " (int value:["
							   << int_value << "])" << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}

		if (int64_value != int_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid 64-bit integer value [" << float_value
							   << "]"
								  " reported for property ["
							   << pname_string << "]"
												  " (int value:["
							   << int_value << "])" << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}
	} /* for (all pnames) */

	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}